

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_utilities.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BamTools::Utilities::Split(string *source,string *delims)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *cstr;
  char *cchars;
  char *tok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fields;
  value_type *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  allocator *paVar4;
  allocator local_69;
  string local_68 [32];
  char *local_48;
  char *local_30;
  char *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1e9169);
  lVar1 = std::__cxx11::string::size();
  pcVar2 = (char *)operator_new__(lVar1 + 1);
  local_48 = pcVar2;
  local_30 = pcVar2;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar2,pcVar3);
  pcVar2 = local_48;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_28 = strtok(pcVar2,pcVar3);
  while (pcVar2 = local_28, local_28 != (char *)0x0) {
    paVar4 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar2,paVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_28 = strtok((char *)0x0,pcVar2);
  }
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> Utilities::Split(const std::string& source, const std::string& delims)
{

    std::vector<std::string> fields;

    char* tok;
    char* cchars = new char[source.size() + 1];
    char* cstr = &cchars[0];
    std::strcpy(cstr, source.c_str());
    tok = std::strtok(cstr, delims.c_str());
    while (tok != NULL) {
        fields.push_back(tok);
        tok = std::strtok(NULL, delims.c_str());
    }

    delete[] cchars;

    return fields;
}